

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_stop(void)

{
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_stop(void) {
#ifdef HAVE_KOKKOS
  Kokkos::finalize();
#endif
#ifdef HAVE_MPI
  MPI_Finalize();
#endif

  return REF_SUCCESS;
}